

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# az.cpp
# Opt level: O1

void __thiscall
arbiter::drivers::AZ::AZ
          (AZ *this,Pool *pool,string *profile,
          unique_ptr<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
          *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  int iVar3;
  string local_90;
  string local_70;
  string local_50;
  
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"az","");
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"http","");
  iVar3 = ::std::__cxx11::string::compare((char *)profile);
  paVar1 = &local_70.field_2;
  local_70._M_dataplus._M_p = (pointer)paVar1;
  if (iVar3 == 0) {
    ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
  }
  else {
    pcVar2 = (profile->_M_dataplus)._M_p;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar2,pcVar2 + profile->_M_string_length);
  }
  Http::Http(&this->super_Http,pool,&local_90,&local_50,&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p);
  }
  (this->super_Http).super_Driver._vptr_Driver = (_func_int **)&PTR__AZ_00194990;
  (this->m_config)._M_t.
  super___uniq_ptr_impl<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
  ._M_t.
  super__Tuple_impl<0UL,_arbiter::drivers::AZ::Config_*,_std::default_delete<arbiter::drivers::AZ::Config>_>
  .super__Head_base<0UL,_arbiter::drivers::AZ::Config_*,_false>._M_head_impl =
       (config->_M_t).
       super___uniq_ptr_impl<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
       ._M_t.
       super__Tuple_impl<0UL,_arbiter::drivers::AZ::Config_*,_std::default_delete<arbiter::drivers::AZ::Config>_>
       .super__Head_base<0UL,_arbiter::drivers::AZ::Config_*,_false>._M_head_impl;
  (config->_M_t).
  super___uniq_ptr_impl<arbiter::drivers::AZ::Config,_std::default_delete<arbiter::drivers::AZ::Config>_>
  ._M_t.
  super__Tuple_impl<0UL,_arbiter::drivers::AZ::Config_*,_std::default_delete<arbiter::drivers::AZ::Config>_>
  .super__Head_base<0UL,_arbiter::drivers::AZ::Config_*,_false>._M_head_impl = (Config *)0x0;
  return;
}

Assistant:

AZ::AZ(
        Pool& pool,
        std::string profile,
        std::unique_ptr<Config> config)
    : Http(pool, "az", "http", profile == "default" ? "" : profile)
    , m_config(std::move(config))
{ }